

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O1

DatabaseName * __thiscall
DatabaseName::derive_temporary(DatabaseName *__return_storage_ptr__,DatabaseName *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  string fname;
  string id;
  long *local_128;
  long local_118;
  long lStack_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  path local_68;
  
  random_hex_string_abi_cxx11_(&local_a8,8);
  std::operator+(&local_88,"temp.",&local_a8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_118 = *plVar3;
    lStack_110 = plVar2[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *plVar3;
    local_128 = (long *)*plVar2;
  }
  lVar1 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::path(&local_68,&this->db_base);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"temp","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_128,lVar1 + (long)local_128);
  DatabaseName(__return_storage_ptr__,&local_68,&local_c8,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

DatabaseName DatabaseName::derive_temporary() const {
    std::string id = random_hex_string(8);
    std::string fname = "temp." + id + ".ursa";
    return DatabaseName(db_base, "temp", id, fname);
}